

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cxx
# Opt level: O1

bool creat_daemon(string *name,bool to_null)

{
  bool bVar1;
  int iVar2;
  __pid_t pid;
  long *plVar3;
  size_type *psVar4;
  char *fmt;
  string *psVar5;
  bool bVar6;
  string pid_file_;
  stat fileInfo;
  string local_c8;
  undefined1 local_a8 [144];
  
  psVar5 = &local_c8;
  DAT_0010b524 = 2;
  if (name->_M_string_length == 0) {
    zpsoe::zlog::_print_log
              (LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fifilyu[P]CommandBridge/src/common.cxx"
               ,0x4f,"The daemon name is invalid.");
    return false;
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8,
                 "/var/run/",name);
  plVar3 = (long *)std::__cxx11::string::append((char *)local_a8);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_c8.field_2._M_allocated_capacity = *psVar4;
    local_c8.field_2._8_8_ = plVar3[3];
    local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  }
  else {
    local_c8.field_2._M_allocated_capacity = *psVar4;
    local_c8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_c8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
    operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
  }
  iVar2 = stat(local_c8._M_dataplus._M_p,(stat *)local_a8);
  if (iVar2 == 0) {
    bVar6 = false;
    zpsoe::zlog::_print_log
              (LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fifilyu[P]CommandBridge/src/common.cxx"
               ,0x56,"%s exists.",local_c8._M_dataplus._M_p);
  }
  else {
    iVar2 = daemon(0,(uint)!to_null);
    if (iVar2 == 0) {
      pid = getpid();
      bVar1 = crt_pid_file(pid,&local_c8);
      bVar6 = true;
      if (bVar1) goto LAB_001063ed;
      fmt = "Cannot create pid file \'%s\'.";
      iVar2 = 99;
    }
    else {
      fmt = "Cannot run %s in the background as system daemons.";
      iVar2 = 0x5d;
      psVar5 = name;
    }
    bVar6 = false;
    zpsoe::zlog::_print_log
              (LOG_ERROR,
               "/workspace/llm4binary/github/license_all_cmakelists_25/fifilyu[P]CommandBridge/src/common.cxx"
               ,iVar2,fmt,(psVar5->_M_dataplus)._M_p);
  }
LAB_001063ed:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

bool creat_daemon(const std::string &name, const bool to_null) {
    G_LogConfig.output_to = LOGOUTPUTSTREAM_STDERR;

    if (name.empty()) {
        print_log(LOG_ERROR, "The daemon name is invalid.");
        return false;
    }

    const std::string pid_file_("/var/run/" + name + ".pid");

    if (is_exist(pid_file_)) {
        print_log(LOG_ERROR, "%s exists.", pid_file_.c_str());
        return false;
    }

    const int noclose_(to_null ? 0 : 1);

    if (daemon(0, noclose_) != 0) {
        print_log(LOG_ERROR, "Cannot run %s in the background as system daemons.", name.c_str());
        return false;
    }

    // 在执行daemon函数之后获取的pid才是实际的子进程pid
    if (!crt_pid_file(getpid(), pid_file_)) {
        print_log(LOG_ERROR, "Cannot create pid file '%s'.", pid_file_.c_str());
        return false;
    }

    return true;
}